

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Direction>
metaf::Direction::fromCardinalString(string *s,bool enableOhdAlqds,bool enableUnknown)

{
  bool bVar1;
  _Storage<metaf::Direction,_true> in_RAX;
  undefined4 uVar2;
  undefined8 unaff_RBX;
  uint uVar3;
  uint uVar4;
  optional<metaf::Direction> oVar5;
  
  if (s->_M_string_length == 0) {
    uVar2 = 0;
  }
  else {
    bVar1 = std::operator==(s,"NDV");
    uVar2 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
    if (bVar1) {
      in_RAX = (_Storage<metaf::Direction,_true>)0x200000000;
    }
    else {
      if (enableOhdAlqds) {
        bVar1 = std::operator==(s,"OHD");
        if (bVar1) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x500000000;
          goto LAB_0018a4a6;
        }
        bVar1 = std::operator==(s,"ALQDS");
        if (bVar1) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x600000000;
          goto LAB_0018a4a6;
        }
      }
      if (enableUnknown) {
        bVar1 = std::operator==(s,"UNKNOWN");
        if (bVar1) {
          in_RAX = (_Storage<metaf::Direction,_true>)0x700000000;
          goto LAB_0018a4a6;
        }
      }
      bVar1 = std::operator==(s,"N");
      uVar3 = 0x168;
      if (!bVar1) {
        uVar3 = 0;
      }
      bVar1 = std::operator==(s,"W");
      uVar4 = 0x10e;
      if (!bVar1) {
        uVar4 = uVar3;
      }
      bVar1 = std::operator==(s,"S");
      uVar3 = 0xb4;
      if (!bVar1) {
        uVar3 = uVar4;
      }
      bVar1 = std::operator==(s,"E");
      uVar4 = 0x5a;
      if (!bVar1) {
        uVar4 = uVar3;
      }
      bVar1 = std::operator==(s,"NW");
      uVar3 = 0x13b;
      if (!bVar1) {
        uVar3 = uVar4;
      }
      bVar1 = std::operator==(s,"NE");
      uVar4 = 0x2d;
      if (!bVar1) {
        uVar4 = uVar3;
      }
      bVar1 = std::operator==(s,"SW");
      uVar3 = 0xe1;
      if (!bVar1) {
        uVar3 = uVar4;
      }
      bVar1 = std::operator==(s,"SE");
      in_RAX = (_Storage<metaf::Direction,_true>)0x87;
      if (!bVar1) {
        in_RAX._M_value.dirType = 0;
        in_RAX._M_value.dirDegrees = uVar3;
      }
      if (in_RAX._M_value.dirDegrees == 0) {
        uVar2 = 0;
      }
      else {
        in_RAX._M_value = in_RAX._M_value | 0x400000000;
      }
    }
  }
LAB_0018a4a6:
  oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Direction>._8_4_ = uVar2;
  oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Direction>._M_payload = in_RAX;
  return (optional<metaf::Direction>)
         oVar5.super__Optional_base<metaf::Direction,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Direction>;
}

Assistant:

TrendGroup() = default;